

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.h
# Opt level: O2

axbStatus_t initMatSparseRandom(axbMat_s *A,size_t nonzeros_per_row)

{
  void *__ptr;
  void *__ptr_00;
  axbStatus_t aVar1;
  int iVar2;
  undefined4 *puVar3;
  ulong uVar4;
  undefined8 uVar5;
  size_t sVar6;
  ulong uVar7;
  int iVar8;
  long lVar9;
  long lVar10;
  int iVar11;
  long lVar12;
  size_t sVar13;
  size_t rows;
  void *local_78;
  void *local_70;
  size_t local_68;
  axbMat_s *local_60;
  undefined4 *local_58;
  ulong local_50;
  long local_48;
  ulong local_40;
  size_t cols;
  
  local_60 = A;
  aVar1 = axbMatGetSizes(A,&rows,&cols);
  if (aVar1 == 0) {
    sVar6 = rows * nonzeros_per_row;
    printf("initMatSparseRandom(): Initializing sparse matrix with %ld rows and %ld nonzeros\n",rows
           ,sVar6);
    sVar13 = rows;
    puVar3 = (undefined4 *)malloc(rows * 4 + 4);
    local_70 = malloc(sVar6 * 4);
    local_68 = sVar6;
    local_78 = malloc(sVar6 * 8);
    *puVar3 = 0;
    uVar7 = sVar13 / nonzeros_per_row >> 1;
    uVar4 = 0;
    lVar9 = 0;
    local_58 = puVar3;
    while (puVar3 = local_58, __ptr_00 = local_70, __ptr = local_78, uVar4 < sVar13) {
      local_40 = uVar4 >> 1;
      lVar10 = (long)(int)lVar9;
      iVar11 = 0;
      local_50 = uVar4;
      local_48 = lVar9;
      for (lVar12 = 0; -nonzeros_per_row != lVar12; lVar12 = lVar12 + -1) {
        iVar8 = iVar11 * (int)uVar7 + (int)local_40;
        iVar2 = rand();
        *(int *)((long)local_70 + lVar10 * 4) = (int)((ulong)(long)iVar2 % uVar7) + iVar8;
        iVar2 = rand();
        *(double *)((long)local_78 + lVar10 * 8) = (double)(iVar2 % 0x3ff + -500) / 300.0 + 1.0;
        lVar10 = lVar10 + 1;
        iVar11 = iVar11 + 1;
      }
      local_58[local_50 + 1] = (int)local_48 - (int)lVar12;
      lVar9 = lVar10;
      sVar13 = rows;
      uVar4 = local_50 + 1;
    }
    aVar1 = axbMatSetValuesCSR(local_60,local_58,AXB_INT_32,local_70,AXB_INT_32,local_78,
                               AXB_REAL_DOUBLE,local_68);
    if (aVar1 == 0) {
      free(puVar3);
      free(__ptr_00);
      free(__ptr);
      return 0;
    }
    uVar5 = 0xa8;
  }
  else {
    uVar5 = 0x91;
  }
  fprintf(_stderr,"Failure in line %d in file %s\n",uVar5,
          "/workspace/llm4binary/github/license_all_cmakelists_25/libaxb[P]libaxb-dev/tests/src/common.h"
         );
  return aVar1;
}

Assistant:

axbStatus_t initMatSparseRandom(struct axbMat_s *A, size_t nonzeros_per_row)
{
  size_t rows, cols;
  AXB_ERR_CHECK(axbMatGetSizes(A, &rows, &cols));
  size_t nonzeros = rows * nonzeros_per_row;

  printf("initMatSparseRandom(): Initializing sparse matrix with %ld rows and %ld nonzeros\n", rows, nonzeros);

  int    *host_rows = malloc(sizeof(int)   *(rows+1));
  int    *host_cols = malloc(sizeof(int)   *(nonzeros));
  double *host_vals = malloc(sizeof(double)*(nonzeros));

  // populate
  host_rows[0] = 0;
  int nnz_index = 0;
  size_t col_inc = rows / nonzeros_per_row / 2;
  for (size_t i=0; i<rows; ++i) {
    for (size_t j=0; j<nonzeros_per_row; ++j) {
      host_cols[nnz_index] = i/2 + col_inc * j + rand() % col_inc;
      host_vals[nnz_index] = 1.0 + (rand() % 1023 - 500.0) / 300.0;
      ++nnz_index;
    }
    host_rows[i+1] = nnz_index;
  }

  // copy over to matrix:
  AXB_ERR_CHECK(axbMatSetValuesCSR(A, host_rows, AXB_INT_32, host_cols, AXB_INT_32, host_vals, AXB_REAL_DOUBLE, nonzeros));

  free(host_rows);
  free(host_cols);
  free(host_vals);
  return 0;
}